

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

string * __thiscall
leveldb::DecompressAllocator::get_abi_cxx11_
          (string *__return_storage_ptr__,DecompressAllocator *this)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 == 0) {
    pbVar1 = (this->stack).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar1) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(pbVar1 + -1));
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
      pbVar1 = (this->stack).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->stack).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
      pcVar2 = pbVar1[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &pbVar1[-1].field_2) {
        operator_delete(pcVar2,pbVar1[-1].field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

std::string DecompressAllocator::get() {
  std::string buffer;
  std::lock_guard<std::mutex> lock(mutex);

  if (!stack.empty()) {
    buffer = std::move(stack.back());
    buffer.clear();
    stack.pop_back();
  }
  return buffer;
}